

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O3

void __thiscall
cmWhileFunctionBlocker::cmWhileFunctionBlocker
          (cmWhileFunctionBlocker *this,cmMakefile *mf,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args)

{
  pointer pcVar1;
  
  (this->super_cmFunctionBlocker).StartingContext.Name._M_dataplus._M_p =
       (pointer)&(this->super_cmFunctionBlocker).StartingContext.Name.field_2;
  (this->super_cmFunctionBlocker).StartingContext.Name._M_string_length = 0;
  (this->super_cmFunctionBlocker).StartingContext.Name.field_2._M_local_buf[0] = '\0';
  (this->super_cmFunctionBlocker).StartingContext.FilePath._M_dataplus._M_p =
       (pointer)&(this->super_cmFunctionBlocker).StartingContext.FilePath.field_2;
  (this->super_cmFunctionBlocker).StartingContext.FilePath._M_string_length = 0;
  (this->super_cmFunctionBlocker).StartingContext.FilePath.field_2._M_local_buf[0] = '\0';
  (this->super_cmFunctionBlocker).StartingContext.Line = 0;
  *(bool *)((long)&(this->super_cmFunctionBlocker).StartingContext.DeferId.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           + 0x20) = false;
  (this->super_cmFunctionBlocker).Functions.
  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_cmFunctionBlocker).Functions.
  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cmFunctionBlocker).Functions.
  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_cmFunctionBlocker).ScopeDepth = 1;
  (this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker =
       (_func_int **)&PTR__cmWhileFunctionBlocker_0084bbb0;
  this->Makefile = mf;
  pcVar1 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->Args).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->Args).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = pcVar1;
  (this->Args).super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cmMakefile::PushLoopBlock(this->Makefile);
  return;
}

Assistant:

cmWhileFunctionBlocker::cmWhileFunctionBlocker(
  cmMakefile* const mf, std::vector<cmListFileArgument> args)
  : Makefile{ mf }
  , Args{ std::move(args) }
{
  this->Makefile->PushLoopBlock();
}